

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int whereLoopAddBtreeIndex(WhereLoopBuilder *pBuilder,SrcItem *pSrc,Index *pProbe,LogEst nInMul)

{
  byte *pbVar1;
  long lVar2;
  byte bVar3;
  ushort uVar4;
  u16 uVar5;
  u16 uVar6;
  ushort uVar7;
  ushort uVar8;
  short sVar9;
  uint uVar10;
  Parse *pParse;
  sqlite3 *db;
  WhereLoop *p;
  ulong uVar11;
  Expr *pExpr;
  u32 opMask;
  char cVar12;
  char cVar13;
  LogEst nRet;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  WhereTerm *pWVar21;
  Expr *pEVar22;
  Select *pSVar23;
  CollSeq *pCVar24;
  u8 uVar25;
  short sVar26;
  LogEst LVar27;
  short sVar28;
  long lVar29;
  ulong uVar30;
  u64 x;
  ulong uVar31;
  short nInMul_00;
  byte bVar32;
  bool bVar33;
  WhereScan scan;
  WhereTerm *local_130;
  uint local_11c;
  WhereTerm *local_118;
  WhereScan local_a0;
  
  pParse = pBuilder->pWInfo->pParse;
  if (pParse->nErr == 0) {
    db = pParse->db;
    p = pBuilder->pNew;
    uVar10 = p->wsFlags;
    uVar19 = 0x18;
    if ((uVar10 & 0x20) == 0) {
      uVar19 = 0x1bf;
    }
    opMask = uVar19 & 0xffffff83;
    if ((*(ushort *)&pProbe->field_0x63 & 4) == 0) {
      opMask = uVar19;
    }
    uVar4 = (p->u).btree.nEq;
    uVar30 = (ulong)uVar4;
    uVar5 = (p->u).btree.nBtm;
    uVar6 = (p->u).btree.nTop;
    uVar7 = p->nSkip;
    uVar8 = p->nLTerm;
    uVar11 = p->prereq;
    sVar9 = p->nOut;
    pWVar21 = whereScanInit(&local_a0,pBuilder->pWC,pSrc->iCursor,(uint)uVar4,opMask,pProbe);
    p->rSetup = 0;
    sVar28 = *pProbe->aiRowLogEst;
    iVar20 = 0;
    local_11c = 0;
    if (10 < (long)sVar28) {
      uVar14 = sqlite3LogEst((long)sVar28);
      local_11c = uVar14 - 0x21;
    }
    if (pWVar21 != (WhereTerm *)0x0) {
      local_118 = (WhereTerm *)0x0;
      local_130 = (WhereTerm *)0x0;
LAB_00194023:
      uVar14 = pWVar21->eOperator;
      if ((uVar14 != 0x100) && ((pWVar21->wtFlags & 0x80) == 0)) {
LAB_00194073:
        iVar17 = 0;
        uVar19 = 4;
        iVar20 = 0;
        if (((pWVar21->prereqRight & p->maskSelf) != 0) ||
           ((iVar20 = iVar17, uVar14 == 0x10 && ((pWVar21->wtFlags & 0x100) != 0))))
        goto LAB_00194097;
        bVar32 = (pSrc->fg).jointype;
        if ((bVar32 & 0x58) != 0) {
          uVar18 = pWVar21->pExpr->flags;
          if ((((uVar18 & 3) == 0) || ((pWVar21->pExpr->w).iJoin != pSrc->iCursor)) ||
             (((bVar32 & 0x18) != 0 && ((uVar18 & 2) != 0)))) goto LAB_00194097;
        }
        if ((pProbe->onError == '\0') || (bVar32 = 2, pProbe->nKeyCol - 1 != (uint)uVar4)) {
          bVar32 = 1;
        }
        pBuilder->bldFlags1 = pBuilder->bldFlags1 | bVar32;
        p->wsFlags = uVar10;
        (p->u).btree.nEq = uVar4;
        (p->u).btree.nBtm = uVar5;
        (p->u).btree.nTop = uVar6;
        p->nLTerm = uVar8;
        if (p->nLSlot <= uVar8) {
          iVar17 = whereLoopResize(db,p,uVar8 + 1);
          uVar19 = 2;
          if (iVar17 != 0) goto LAB_00194097;
        }
        uVar16 = p->nLTerm;
        uVar15 = uVar16 + 1;
        p->nLTerm = uVar15;
        p->aLTerm[uVar16] = pWVar21;
        p->prereq = ~p->maskSelf & (pWVar21->prereqRight | uVar11);
        if ((uVar14 & 1) != 0) {
          pEVar22 = pWVar21->pExpr;
          if ((pEVar22->flags & 0x1000) == 0) {
            uVar18 = 0;
            if (((pEVar22->x).pList != (ExprList *)0x0) &&
               (x = (u64)((pEVar22->x).pList)->nExpr, x != 0)) {
              LVar27 = sqlite3LogEst(x);
              uVar18 = (uint)LVar27;
            }
          }
          else {
            uVar18 = 0x2e;
            if (1 < uVar15) {
              uVar18 = 0x2e;
              uVar31 = 0;
              do {
                if ((p->aLTerm[uVar31] != (WhereTerm *)0x0) && (p->aLTerm[uVar31]->pExpr == pEVar22)
                   ) {
                  uVar18 = 0;
                }
                uVar31 = uVar31 + 1;
              } while (uVar15 - 1 != uVar31);
            }
          }
          if (((pProbe->field_0x63 & 0x80) == 0) || ((short)local_11c < 10)) {
LAB_001944e8:
            *(byte *)&p->wsFlags = (byte)p->wsFlags | 4;
            uVar19 = 0;
          }
          else {
            uVar16 = pProbe->aiRowLogEst[uVar30];
            uVar19 = 0;
            if (10 < (int)uVar18) {
              uVar15 = sqlite3LogEst((ulong)(uVar18 & 0xffff));
              uVar19 = uVar15 - 0x21 & 0xffff;
            }
            uVar19 = ((uint)uVar16 - ((local_11c & 0xffff) + uVar18)) + uVar19 + 10 & 0x8000;
            bVar33 = uVar19 == 0;
            if (nInMul < 2 && !bVar33) {
              uVar19 = 0;
              if ((db->dbOptFlags & 0x20000) == 0) {
                pbVar1 = (byte *)((long)&p->wsFlags + 2);
                *pbVar1 = *pbVar1 | 0x10;
                bVar33 = true;
              }
              else {
                uVar19 = 4;
                bVar33 = false;
              }
            }
            else {
              uVar19 = uVar19 >> 0xd;
            }
            if (bVar33) goto LAB_001944e8;
          }
          if (uVar19 == 0) goto LAB_001944f7;
          goto LAB_00194097;
        }
        if ((uVar14 & 0x82) == 0) {
          uVar19 = 8;
          if ((uVar14 >> 8 & 1) != 0) goto LAB_001944be;
          pEVar22 = pWVar21->pExpr->pLeft;
          uVar25 = pEVar22->op;
          if (uVar25 == 0xb0) {
            uVar25 = pEVar22->op2;
          }
          if (uVar25 == 0xb1) {
LAB_0019433e:
            uVar19 = ((pEVar22->x).pList)->nExpr;
          }
          else {
            uVar19 = 1;
            if (uVar25 == 0x8a) {
              pEVar22 = (Expr *)(pEVar22->x).pList;
              goto LAB_0019433e;
            }
          }
          uVar18 = (uint)pProbe->nColumn - (uint)uVar4;
          if ((int)uVar19 < (int)uVar18) {
            uVar18 = uVar19;
          }
          uVar31 = 1;
          if (1 < (int)uVar18) {
            iVar20 = pSrc->iCursor;
            uVar31 = 1;
LAB_0019437e:
            pSVar23 = (Select *)pWVar21->pExpr->pRight;
            if ((pSVar23->selFlags & 0x1000) != 0) {
              pSVar23 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar23->pEList)->pSelect;
            }
            pEVar22 = ((pWVar21->pExpr->pLeft->x).pList)->a[uVar31].pExpr;
            if ((((pEVar22->op == 0xa7) && (pEVar22->iTable == iVar20)) &&
                (lVar2 = uVar31 + uVar30, pEVar22->iColumn == pProbe->aiColumn[lVar2])) &&
               (pProbe->aSortOrder[lVar2] == pProbe->aSortOrder[uVar30])) {
              pExpr = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar23->pEList)->pList->a[uVar31].pExpr;
              cVar12 = sqlite3ExprAffinity(pEVar22);
              cVar13 = sqlite3CompareAffinity(pExpr,cVar12);
              sVar26 = pEVar22->iColumn;
              cVar12 = 'D';
              if ((-1 < (long)sVar26) && (sVar26 < pProbe->pTable->nCol)) {
                cVar12 = pProbe->pTable->aCol[sVar26].affinity;
              }
              if ((cVar13 == cVar12) &&
                 (pCVar24 = sqlite3BinaryCompareCollSeq(pParse,pEVar22,pExpr),
                 pCVar24 != (CollSeq *)0x0)) {
                lVar29 = 0;
                do {
                  bVar32 = pCVar24->zName[lVar29];
                  bVar3 = pProbe->azColl[lVar2][lVar29];
                  if (bVar32 == bVar3) {
                    if ((ulong)bVar32 == 0) goto LAB_00194494;
                  }
                  else if (""[bVar32] != ""[bVar3]) goto LAB_00194494;
                  lVar29 = lVar29 + 1;
                } while( true );
              }
            }
          }
          goto LAB_00194723;
        }
        sVar26 = pProbe->aiColumn[uVar30];
        uVar19 = p->wsFlags;
        p->wsFlags = uVar19 | 1;
        uVar18 = 0x1001;
        if (sVar26 == -1) {
LAB_001941f9:
          p->wsFlags = uVar19 | uVar18;
        }
        else if (((nInMul == 0) && (-1 < sVar26)) && (pProbe->nKeyCol - 1 == (uint)uVar4)) {
          if (((pProbe->field_0x63 & 8) == 0) &&
             (((pProbe->nKeyCol != 1 || (uVar14 != 2)) || (pProbe->onError == '\0')))) {
            uVar18 = 0x10001;
          }
          goto LAB_001941f9;
        }
        uVar18 = 0;
        uVar19 = 0x200000;
        if (1 < local_a0.iEquiv) {
LAB_001944be:
          p->wsFlags = p->wsFlags | uVar19;
          uVar18 = 0;
        }
        goto LAB_001944f7;
      }
      sVar26 = pProbe->aiColumn[uVar30];
      if ((long)sVar26 < 0) {
        bVar32 = sVar26 == -1;
      }
      else {
        bVar32 = pProbe->pTable->aCol[sVar26].field_0x8 & 0xf;
      }
      if (bVar32 == 0) goto LAB_00194073;
      uVar19 = 4;
      iVar20 = 0;
      goto LAB_00194097;
    }
LAB_00194805:
    p->prereq = uVar11;
    (p->u).btree.nEq = uVar4;
    (p->u).btree.nBtm = uVar5;
    (p->u).btree.nTop = uVar6;
    p->nSkip = uVar7;
    p->wsFlags = uVar10;
    p->nOut = sVar9;
    p->nLTerm = uVar8;
    if (((uVar4 == uVar7) && (uVar4 + 1 < (uint)pProbe->nKeyCol)) &&
       ((((uVar4 == uVar8 &&
          (((*(ushort *)&pProbe->field_0x63 & 0xc0) == 0x80 && ((db->dbOptFlags & 0x4000) == 0))))
         && (0x29 < pProbe->aiRowLogEst[uVar30 + 1])) &&
        (iVar20 = whereLoopResize(db,p,uVar8 + 1), iVar20 == 0)))) {
      (p->u).btree.nEq = (p->u).btree.nEq + 1;
      p->nSkip = p->nSkip + 1;
      uVar8 = p->nLTerm;
      p->nLTerm = uVar8 + 1;
      p->aLTerm[uVar8] = (WhereTerm *)0x0;
      pbVar1 = (byte *)((long)&p->wsFlags + 1);
      *pbVar1 = *pbVar1 | 0x80;
      sVar28 = pProbe->aiRowLogEst[uVar30] - pProbe->aiRowLogEst[uVar30 + 1];
      p->nOut = p->nOut - sVar28;
      whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,nInMul + sVar28 + 5);
      p->nOut = sVar9;
      (p->u).btree.nEq = uVar4;
      p->nSkip = uVar7;
      p->wsFlags = uVar10;
      iVar20 = 0;
    }
  }
  else {
    iVar20 = pParse->rc;
  }
  return iVar20;
LAB_00194494:
  if (bVar32 != bVar3) goto LAB_00194723;
  uVar31 = uVar31 + 1;
  if (uVar31 == uVar18) goto code_r0x001944b3;
  goto LAB_0019437e;
code_r0x001944b3:
  uVar31 = (ulong)uVar18;
LAB_00194723:
  uVar18 = p->wsFlags;
  if ((uVar14 & 0x24) == 0) {
    p->wsFlags = uVar18 | 0x12;
    (p->u).btree.nTop = (u16)uVar31;
    uVar19 = 0;
    bVar33 = true;
    local_118 = pWVar21;
    if ((uVar18 & 0x20) == 0) {
      local_130 = (WhereTerm *)0x0;
    }
    else {
      local_130 = p->aLTerm[(ulong)p->nLTerm - 2];
    }
  }
  else {
    p->wsFlags = uVar18 | 0x22;
    (p->u).btree.nBtm = (u16)uVar31;
    bVar33 = true;
    local_130 = pWVar21;
    if ((pWVar21->wtFlags & 0x100) == 0) {
      uVar19 = 0;
      local_118 = (WhereTerm *)0x0;
    }
    else {
      local_118 = pWVar21 + 1;
      iVar20 = whereLoopResize(db,p,p->nLTerm + 1);
      uVar19 = 0;
      if (iVar20 == 0) {
        uVar16 = p->nLTerm;
        p->nLTerm = uVar16 + 1;
        p->aLTerm[uVar16] = local_118;
        *(byte *)&p->wsFlags = (byte)p->wsFlags | 0x10;
        (p->u).btree.nTop = 1;
        bVar33 = true;
      }
      else {
        uVar19 = 2;
        bVar33 = false;
      }
    }
  }
  uVar18 = 0;
  iVar20 = 0;
  if (!bVar33) goto LAB_00194097;
LAB_001944f7:
  if ((p->wsFlags & 2) == 0) {
    uVar19 = (p->u).vtab.idxNum + 1;
    (p->u).btree.nEq = (u16)uVar19;
    if ((pWVar21->truthProb < 1) && (-1 < pProbe->aiColumn[uVar30])) {
      uVar16 = (pWVar21->truthProb - (short)uVar18) + p->nOut;
      goto LAB_00194609;
    }
    uVar31 = (ulong)(uVar19 & 0xffff);
    sVar26 = (pProbe->aiRowLogEst[uVar31] - pProbe->aiRowLogEst[uVar31 - 1]) + p->nOut;
    p->nOut = sVar26;
    if ((uVar14 >> 8 & 1) != 0) {
      uVar16 = sVar26 + 10;
      goto LAB_00194609;
    }
  }
  else {
    uVar14 = p->nOut;
    uVar16 = uVar14;
    if (local_130 != (WhereTerm *)0x0) {
      if (local_130->truthProb < 1) {
        uVar16 = local_130->truthProb + uVar14;
      }
      else {
        uVar16 = uVar14 - 0x14;
        if ((local_130->wtFlags & 0x80) != 0) {
          uVar16 = uVar14;
        }
      }
    }
    uVar15 = uVar16;
    if (local_118 != (WhereTerm *)0x0) {
      if (local_118->truthProb < 1) {
        uVar15 = local_118->truthProb + uVar16;
      }
      else {
        uVar15 = uVar16 - 0x14;
        if ((local_118->wtFlags & 0x80) != 0) {
          uVar15 = uVar16;
        }
      }
    }
    uVar16 = uVar15;
    if (((local_130 != (WhereTerm *)0x0) && (local_118 != (WhereTerm *)0x0)) &&
       ((0 < local_130->truthProb && (uVar16 = uVar15 - 0x14, local_118->truthProb < 1)))) {
      uVar16 = uVar15;
    }
    iVar20 = (-1 - (uint)(local_130 != (WhereTerm *)0x0)) + (uint)(local_118 == (WhereTerm *)0x0) +
             (int)(short)uVar14;
    uVar14 = 10;
    if (10 < (short)uVar16) {
      uVar14 = uVar16;
    }
    uVar16 = (ushort)iVar20;
    if ((int)(uint)uVar14 <= iVar20) {
      uVar16 = uVar14;
    }
LAB_00194609:
    p->nOut = uVar16;
  }
  if ((~*(ushort *)&pProbe->field_0x63 & 3) == 0) {
    LVar27 = p->nOut + 0x10;
  }
  else {
    LVar27 = p->nOut + (short)((pProbe->szIdxRow * 0xf) / (int)pSrc->pTab->szTabRow) + 1;
  }
  LVar27 = sqlite3LogEstAdd((short)local_11c,LVar27);
  p->rRun = LVar27;
  if ((p->wsFlags & 0x4000140) == 0) {
    LVar27 = sqlite3LogEstAdd(LVar27,p->nOut + 0x10);
    p->rRun = LVar27;
  }
  nInMul_00 = (short)uVar18 + nInMul;
  p->rRun = p->rRun + nInMul_00;
  sVar26 = p->nOut;
  p->nOut = nInMul_00 + sVar26;
  whereLoopOutputAdjust(pBuilder->pWC,p,sVar28);
  iVar20 = whereLoopInsert(pBuilder,p);
  if ((p->wsFlags & 2) != 0) {
    sVar26 = sVar9;
  }
  p->nOut = sVar26;
  if ((((p->wsFlags & 0x10) == 0) && (uVar14 = (p->u).btree.nEq, uVar14 < pProbe->nColumn)) &&
     ((uVar14 < pProbe->nKeyCol || ((*(ushort *)&pProbe->field_0x63 & 3) != 2)))) {
    if (3 < uVar14) {
      sqlite3ProgressCheck(pParse);
    }
    whereLoopAddBtreeIndex(pBuilder,pSrc,pProbe,nInMul_00);
  }
  p->nOut = sVar9;
  uVar19 = 0;
LAB_00194097:
  if (((uVar19 == 2) || (pWVar21 = whereScanNext(&local_a0), iVar20 != 0)) ||
     (pWVar21 == (WhereTerm *)0x0)) goto LAB_00194805;
  goto LAB_00194023;
}

Assistant:

static int whereLoopAddBtreeIndex(
  WhereLoopBuilder *pBuilder,     /* The WhereLoop factory */
  SrcItem *pSrc,                  /* FROM clause term being analyzed */
  Index *pProbe,                  /* An index on pSrc */
  LogEst nInMul                   /* log(Number of iterations due to IN) */
){
  WhereInfo *pWInfo = pBuilder->pWInfo;  /* WHERE analyze context */
  Parse *pParse = pWInfo->pParse;        /* Parsing context */
  sqlite3 *db = pParse->db;       /* Database connection malloc context */
  WhereLoop *pNew;                /* Template WhereLoop under construction */
  WhereTerm *pTerm;               /* A WhereTerm under consideration */
  int opMask;                     /* Valid operators for constraints */
  WhereScan scan;                 /* Iterator for WHERE terms */
  Bitmask saved_prereq;           /* Original value of pNew->prereq */
  u16 saved_nLTerm;               /* Original value of pNew->nLTerm */
  u16 saved_nEq;                  /* Original value of pNew->u.btree.nEq */
  u16 saved_nBtm;                 /* Original value of pNew->u.btree.nBtm */
  u16 saved_nTop;                 /* Original value of pNew->u.btree.nTop */
  u16 saved_nSkip;                /* Original value of pNew->nSkip */
  u32 saved_wsFlags;              /* Original value of pNew->wsFlags */
  LogEst saved_nOut;              /* Original value of pNew->nOut */
  int rc = SQLITE_OK;             /* Return code */
  LogEst rSize;                   /* Number of rows in the table */
  LogEst rLogSize;                /* Logarithm of table size */
  WhereTerm *pTop = 0, *pBtm = 0; /* Top and bottom range constraints */

  pNew = pBuilder->pNew;
  assert( db->mallocFailed==0 || pParse->nErr>0 );
  if( pParse->nErr ){
    return pParse->rc;
  }
  WHERETRACE(0x800, ("BEGIN %s.addBtreeIdx(%s), nEq=%d, nSkip=%d, rRun=%d\n",
                     pProbe->pTable->zName,pProbe->zName,
                     pNew->u.btree.nEq, pNew->nSkip, pNew->rRun));

  assert( (pNew->wsFlags & WHERE_VIRTUALTABLE)==0 );
  assert( (pNew->wsFlags & WHERE_TOP_LIMIT)==0 );
  if( pNew->wsFlags & WHERE_BTM_LIMIT ){
    opMask = WO_LT|WO_LE;
  }else{
    assert( pNew->u.btree.nBtm==0 );
    opMask = WO_EQ|WO_IN|WO_GT|WO_GE|WO_LT|WO_LE|WO_ISNULL|WO_IS;
  }
  if( pProbe->bUnordered ) opMask &= ~(WO_GT|WO_GE|WO_LT|WO_LE);

  assert( pNew->u.btree.nEq<pProbe->nColumn );
  assert( pNew->u.btree.nEq<pProbe->nKeyCol
       || pProbe->idxType!=SQLITE_IDXTYPE_PRIMARYKEY );

  saved_nEq = pNew->u.btree.nEq;
  saved_nBtm = pNew->u.btree.nBtm;
  saved_nTop = pNew->u.btree.nTop;
  saved_nSkip = pNew->nSkip;
  saved_nLTerm = pNew->nLTerm;
  saved_wsFlags = pNew->wsFlags;
  saved_prereq = pNew->prereq;
  saved_nOut = pNew->nOut;
  pTerm = whereScanInit(&scan, pBuilder->pWC, pSrc->iCursor, saved_nEq,
                        opMask, pProbe);
  pNew->rSetup = 0;
  rSize = pProbe->aiRowLogEst[0];
  rLogSize = estLog(rSize);
  for(; rc==SQLITE_OK && pTerm!=0; pTerm = whereScanNext(&scan)){
    u16 eOp = pTerm->eOperator;   /* Shorthand for pTerm->eOperator */
    LogEst rCostIdx;
    LogEst nOutUnadjusted;        /* nOut before IN() and WHERE adjustments */
    int nIn = 0;
#ifdef SQLITE_ENABLE_STAT4
    int nRecValid = pBuilder->nRecValid;
#endif
    if( (eOp==WO_ISNULL || (pTerm->wtFlags&TERM_VNULL)!=0)
     && indexColumnNotNull(pProbe, saved_nEq)
    ){
      continue; /* ignore IS [NOT] NULL constraints on NOT NULL columns */
    }
    if( pTerm->prereqRight & pNew->maskSelf ) continue;

    /* Do not allow the upper bound of a LIKE optimization range constraint
    ** to mix with a lower range bound from some other source */
    if( pTerm->wtFlags & TERM_LIKEOPT && pTerm->eOperator==WO_LT ) continue;

    if( (pSrc->fg.jointype & (JT_LEFT|JT_LTORJ|JT_RIGHT))!=0
     && !constraintCompatibleWithOuterJoin(pTerm,pSrc)
    ){
      continue;
    }
    if( IsUniqueIndex(pProbe) && saved_nEq==pProbe->nKeyCol-1 ){
      pBuilder->bldFlags1 |= SQLITE_BLDF1_UNIQUE;
    }else{
      pBuilder->bldFlags1 |= SQLITE_BLDF1_INDEXED;
    }
    pNew->wsFlags = saved_wsFlags;
    pNew->u.btree.nEq = saved_nEq;
    pNew->u.btree.nBtm = saved_nBtm;
    pNew->u.btree.nTop = saved_nTop;
    pNew->nLTerm = saved_nLTerm;
    if( pNew->nLTerm>=pNew->nLSlot
     && whereLoopResize(db, pNew, pNew->nLTerm+1)
    ){
       break; /* OOM while trying to enlarge the pNew->aLTerm array */
    }
    pNew->aLTerm[pNew->nLTerm++] = pTerm;
    pNew->prereq = (saved_prereq | pTerm->prereqRight) & ~pNew->maskSelf;

    assert( nInMul==0
        || (pNew->wsFlags & WHERE_COLUMN_NULL)!=0
        || (pNew->wsFlags & WHERE_COLUMN_IN)!=0
        || (pNew->wsFlags & WHERE_SKIPSCAN)!=0
    );

    if( eOp & WO_IN ){
      Expr *pExpr = pTerm->pExpr;
      if( ExprUseXSelect(pExpr) ){
        /* "x IN (SELECT ...)":  TUNING: the SELECT returns 25 rows */
        int i;
        nIn = 46;  assert( 46==sqlite3LogEst(25) );

        /* The expression may actually be of the form (x, y) IN (SELECT...).
        ** In this case there is a separate term for each of (x) and (y).
        ** However, the nIn multiplier should only be applied once, not once
        ** for each such term. The following loop checks that pTerm is the
        ** first such term in use, and sets nIn back to 0 if it is not. */
        for(i=0; i<pNew->nLTerm-1; i++){
          if( pNew->aLTerm[i] && pNew->aLTerm[i]->pExpr==pExpr ) nIn = 0;
        }
      }else if( ALWAYS(pExpr->x.pList && pExpr->x.pList->nExpr) ){
        /* "x IN (value, value, ...)" */
        nIn = sqlite3LogEst(pExpr->x.pList->nExpr);
      }
      if( pProbe->hasStat1 && rLogSize>=10 ){
        LogEst M, logK, x;
        /* Let:
        **   N = the total number of rows in the table
        **   K = the number of entries on the RHS of the IN operator
        **   M = the number of rows in the table that match terms to the
        **       to the left in the same index.  If the IN operator is on
        **       the left-most index column, M==N.
        **
        ** Given the definitions above, it is better to omit the IN operator
        ** from the index lookup and instead do a scan of the M elements,
        ** testing each scanned row against the IN operator separately, if:
        **
        **        M*log(K) < K*log(N)
        **
        ** Our estimates for M, K, and N might be inaccurate, so we build in
        ** a safety margin of 2 (LogEst: 10) that favors using the IN operator
        ** with the index, as using an index has better worst-case behavior.
        ** If we do not have real sqlite_stat1 data, always prefer to use
        ** the index.  Do not bother with this optimization on very small
        ** tables (less than 2 rows) as it is pointless in that case.
        */
        M = pProbe->aiRowLogEst[saved_nEq];
        logK = estLog(nIn);
        /* TUNING      v-----  10 to bias toward indexed IN */
        x = M + logK + 10 - (nIn + rLogSize);
        if( x>=0 ){
          WHERETRACE(0x40,
            ("IN operator (N=%d M=%d logK=%d nIn=%d rLogSize=%d x=%d) "
             "prefers indexed lookup\n",
             saved_nEq, M, logK, nIn, rLogSize, x));
        }else if( nInMul<2 && OptimizationEnabled(db, SQLITE_SeekScan) ){
          WHERETRACE(0x40,
            ("IN operator (N=%d M=%d logK=%d nIn=%d rLogSize=%d x=%d"
             " nInMul=%d) prefers skip-scan\n",
             saved_nEq, M, logK, nIn, rLogSize, x, nInMul));
          pNew->wsFlags |= WHERE_IN_SEEKSCAN;
        }else{
          WHERETRACE(0x40,
            ("IN operator (N=%d M=%d logK=%d nIn=%d rLogSize=%d x=%d"
             " nInMul=%d) prefers normal scan\n",
             saved_nEq, M, logK, nIn, rLogSize, x, nInMul));
          continue;
        }
      }
      pNew->wsFlags |= WHERE_COLUMN_IN;
    }else if( eOp & (WO_EQ|WO_IS) ){
      int iCol = pProbe->aiColumn[saved_nEq];
      pNew->wsFlags |= WHERE_COLUMN_EQ;
      assert( saved_nEq==pNew->u.btree.nEq );
      if( iCol==XN_ROWID
       || (iCol>=0 && nInMul==0 && saved_nEq==pProbe->nKeyCol-1)
      ){
        if( iCol==XN_ROWID || pProbe->uniqNotNull
         || (pProbe->nKeyCol==1 && pProbe->onError && eOp==WO_EQ)
        ){
          pNew->wsFlags |= WHERE_ONEROW;
        }else{
          pNew->wsFlags |= WHERE_UNQ_WANTED;
        }
      }
      if( scan.iEquiv>1 ) pNew->wsFlags |= WHERE_TRANSCONS;
    }else if( eOp & WO_ISNULL ){
      pNew->wsFlags |= WHERE_COLUMN_NULL;
    }else{
      int nVecLen = whereRangeVectorLen(
          pParse, pSrc->iCursor, pProbe, saved_nEq, pTerm
      );
      if( eOp & (WO_GT|WO_GE) ){
        testcase( eOp & WO_GT );
        testcase( eOp & WO_GE );
        pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_BTM_LIMIT;
        pNew->u.btree.nBtm = nVecLen;
        pBtm = pTerm;
        pTop = 0;
        if( pTerm->wtFlags & TERM_LIKEOPT ){
          /* Range constraints that come from the LIKE optimization are
          ** always used in pairs. */
          pTop = &pTerm[1];
          assert( (pTop-(pTerm->pWC->a))<pTerm->pWC->nTerm );
          assert( pTop->wtFlags & TERM_LIKEOPT );
          assert( pTop->eOperator==WO_LT );
          if( whereLoopResize(db, pNew, pNew->nLTerm+1) ) break; /* OOM */
          pNew->aLTerm[pNew->nLTerm++] = pTop;
          pNew->wsFlags |= WHERE_TOP_LIMIT;
          pNew->u.btree.nTop = 1;
        }
      }else{
        assert( eOp & (WO_LT|WO_LE) );
        testcase( eOp & WO_LT );
        testcase( eOp & WO_LE );
        pNew->wsFlags |= WHERE_COLUMN_RANGE|WHERE_TOP_LIMIT;
        pNew->u.btree.nTop = nVecLen;
        pTop = pTerm;
        pBtm = (pNew->wsFlags & WHERE_BTM_LIMIT)!=0 ?
                       pNew->aLTerm[pNew->nLTerm-2] : 0;
      }
    }

    /* At this point pNew->nOut is set to the number of rows expected to
    ** be visited by the index scan before considering term pTerm, or the
    ** values of nIn and nInMul. In other words, assuming that all
    ** "x IN(...)" terms are replaced with "x = ?". This block updates
    ** the value of pNew->nOut to account for pTerm (but not nIn/nInMul).  */
    assert( pNew->nOut==saved_nOut );
    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      /* Adjust nOut using stat4 data. Or, if there is no stat4
      ** data, using some other estimate.  */
      whereRangeScanEst(pParse, pBuilder, pBtm, pTop, pNew);
    }else{
      int nEq = ++pNew->u.btree.nEq;
      assert( eOp & (WO_ISNULL|WO_EQ|WO_IN|WO_IS) );

      assert( pNew->nOut==saved_nOut );
      if( pTerm->truthProb<=0 && pProbe->aiColumn[saved_nEq]>=0 ){
        assert( (eOp & WO_IN) || nIn==0 );
        testcase( eOp & WO_IN );
        pNew->nOut += pTerm->truthProb;
        pNew->nOut -= nIn;
      }else{
#ifdef SQLITE_ENABLE_STAT4
        tRowcnt nOut = 0;
        if( nInMul==0
         && pProbe->nSample
         && ALWAYS(pNew->u.btree.nEq<=pProbe->nSampleCol)
         && ((eOp & WO_IN)==0 || ExprUseXList(pTerm->pExpr))
         && OptimizationEnabled(db, SQLITE_Stat4)
        ){
          Expr *pExpr = pTerm->pExpr;
          if( (eOp & (WO_EQ|WO_ISNULL|WO_IS))!=0 ){
            testcase( eOp & WO_EQ );
            testcase( eOp & WO_IS );
            testcase( eOp & WO_ISNULL );
            rc = whereEqualScanEst(pParse, pBuilder, pExpr->pRight, &nOut);
          }else{
            rc = whereInScanEst(pParse, pBuilder, pExpr->x.pList, &nOut);
          }
          if( rc==SQLITE_NOTFOUND ) rc = SQLITE_OK;
          if( rc!=SQLITE_OK ) break;          /* Jump out of the pTerm loop */
          if( nOut ){
            pNew->nOut = sqlite3LogEst(nOut);
            if( nEq==1
             /* TUNING: Mark terms as "low selectivity" if they seem likely
             ** to be true for half or more of the rows in the table.
             ** See tag-202002240-1 */
             && pNew->nOut+10 > pProbe->aiRowLogEst[0]
            ){
#if WHERETRACE_ENABLED /* 0x01 */
              if( sqlite3WhereTrace & 0x20 ){
                sqlite3DebugPrintf(
                   "STAT4 determines term has low selectivity:\n");
                sqlite3WhereTermPrint(pTerm, 999);
              }
#endif
              pTerm->wtFlags |= TERM_HIGHTRUTH;
              if( pTerm->wtFlags & TERM_HEURTRUTH ){
                /* If the term has previously been used with an assumption of
                ** higher selectivity, then set the flag to rerun the
                ** loop computations. */
                pBuilder->bldFlags2 |= SQLITE_BLDF2_2NDPASS;
              }
            }
            if( pNew->nOut>saved_nOut ) pNew->nOut = saved_nOut;
            pNew->nOut -= nIn;
          }
        }
        if( nOut==0 )
#endif
        {
          pNew->nOut += (pProbe->aiRowLogEst[nEq] - pProbe->aiRowLogEst[nEq-1]);
          if( eOp & WO_ISNULL ){
            /* TUNING: If there is no likelihood() value, assume that a
            ** "col IS NULL" expression matches twice as many rows
            ** as (col=?). */
            pNew->nOut += 10;
          }
        }
      }
    }

    /* Set rCostIdx to the cost of visiting selected rows in index. Add
    ** it to pNew->rRun, which is currently set to the cost of the index
    ** seek only. Then, if this is a non-covering index, add the cost of
    ** visiting the rows in the main table.  */
    assert( pSrc->pTab->szTabRow>0 );
    if( pProbe->idxType==SQLITE_IDXTYPE_IPK ){
      /* The pProbe->szIdxRow is low for an IPK table since the interior
      ** pages are small.  Thus szIdxRow gives a good estimate of seek cost.
      ** But the leaf pages are full-size, so pProbe->szIdxRow would badly
      ** under-estimate the scanning cost. */
      rCostIdx = pNew->nOut + 16;
    }else{
      rCostIdx = pNew->nOut + 1 + (15*pProbe->szIdxRow)/pSrc->pTab->szTabRow;
    }
    pNew->rRun = sqlite3LogEstAdd(rLogSize, rCostIdx);
    if( (pNew->wsFlags & (WHERE_IDX_ONLY|WHERE_IPK|WHERE_EXPRIDX))==0 ){
      pNew->rRun = sqlite3LogEstAdd(pNew->rRun, pNew->nOut + 16);
    }
    ApplyCostMultiplier(pNew->rRun, pProbe->pTable->costMult);

    nOutUnadjusted = pNew->nOut;
    pNew->rRun += nInMul + nIn;
    pNew->nOut += nInMul + nIn;
    whereLoopOutputAdjust(pBuilder->pWC, pNew, rSize);
    rc = whereLoopInsert(pBuilder, pNew);

    if( pNew->wsFlags & WHERE_COLUMN_RANGE ){
      pNew->nOut = saved_nOut;
    }else{
      pNew->nOut = nOutUnadjusted;
    }

    if( (pNew->wsFlags & WHERE_TOP_LIMIT)==0
     && pNew->u.btree.nEq<pProbe->nColumn
     && (pNew->u.btree.nEq<pProbe->nKeyCol ||
           pProbe->idxType!=SQLITE_IDXTYPE_PRIMARYKEY)
    ){
      if( pNew->u.btree.nEq>3 ){
        sqlite3ProgressCheck(pParse);
      }
      whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nInMul+nIn);
    }
    pNew->nOut = saved_nOut;
#ifdef SQLITE_ENABLE_STAT4
    pBuilder->nRecValid = nRecValid;
#endif
  }
  pNew->prereq = saved_prereq;
  pNew->u.btree.nEq = saved_nEq;
  pNew->u.btree.nBtm = saved_nBtm;
  pNew->u.btree.nTop = saved_nTop;
  pNew->nSkip = saved_nSkip;
  pNew->wsFlags = saved_wsFlags;
  pNew->nOut = saved_nOut;
  pNew->nLTerm = saved_nLTerm;

  /* Consider using a skip-scan if there are no WHERE clause constraints
  ** available for the left-most terms of the index, and if the average
  ** number of repeats in the left-most terms is at least 18.
  **
  ** The magic number 18 is selected on the basis that scanning 17 rows
  ** is almost always quicker than an index seek (even though if the index
  ** contains fewer than 2^17 rows we assume otherwise in other parts of
  ** the code). And, even if it is not, it should not be too much slower.
  ** On the other hand, the extra seeks could end up being significantly
  ** more expensive.  */
  assert( 42==sqlite3LogEst(18) );
  if( saved_nEq==saved_nSkip
   && saved_nEq+1<pProbe->nKeyCol
   && saved_nEq==pNew->nLTerm
   && pProbe->noSkipScan==0
   && pProbe->hasStat1!=0
   && OptimizationEnabled(db, SQLITE_SkipScan)
   && pProbe->aiRowLogEst[saved_nEq+1]>=42  /* TUNING: Minimum for skip-scan */
   && (rc = whereLoopResize(db, pNew, pNew->nLTerm+1))==SQLITE_OK
  ){
    LogEst nIter;
    pNew->u.btree.nEq++;
    pNew->nSkip++;
    pNew->aLTerm[pNew->nLTerm++] = 0;
    pNew->wsFlags |= WHERE_SKIPSCAN;
    nIter = pProbe->aiRowLogEst[saved_nEq] - pProbe->aiRowLogEst[saved_nEq+1];
    pNew->nOut -= nIter;
    /* TUNING:  Because uncertainties in the estimates for skip-scan queries,
    ** add a 1.375 fudge factor to make skip-scan slightly less likely. */
    nIter += 5;
    whereLoopAddBtreeIndex(pBuilder, pSrc, pProbe, nIter + nInMul);
    pNew->nOut = saved_nOut;
    pNew->u.btree.nEq = saved_nEq;
    pNew->nSkip = saved_nSkip;
    pNew->wsFlags = saved_wsFlags;
  }

  WHERETRACE(0x800, ("END %s.addBtreeIdx(%s), nEq=%d, rc=%d\n",
                      pProbe->pTable->zName, pProbe->zName, saved_nEq, rc));
  return rc;
}